

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbest_generator.cpp
# Opt level: O2

bool __thiscall MeCab::NBestGenerator::next(NBestGenerator *this)

{
  uchar uVar1;
  int iVar2;
  pointer ppQVar3;
  Node *pNVar4;
  mecab_path_t *pmVar5;
  QueueElement *pQVar6;
  Node *pNVar7;
  mecab_path_t **ppmVar8;
  QueueElement *n;
  QueueElement *local_48;
  pointer local_40;
  NBestGenerator *local_38;
  
  local_38 = this;
  do {
    ppQVar3 = (local_38->agenda_).c.
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_38->agenda_).c.
               super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppQVar3 == local_40) break;
    pQVar6 = *ppQVar3;
    std::
    priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
    ::pop(&this->agenda_);
    pNVar7 = pQVar6->node;
    uVar1 = pNVar7->stat;
    if (uVar1 == '\x02') {
      while (pQVar6 = pQVar6->next, pQVar6 != (QueueElement *)0x0) {
        pNVar4 = pQVar6->node;
        pNVar7->next = pNVar4;
        pNVar4->prev = pNVar7;
        pNVar7 = pNVar4;
      }
    }
    else {
      ppmVar8 = &pNVar7->lpath;
      while (pmVar5 = *ppmVar8, pmVar5 != (mecab_path_t *)0x0) {
        local_48 = FreeList<MeCab::NBestGenerator::QueueElement>::alloc(&this->freelist_);
        pNVar7 = pmVar5->lnode;
        local_48->node = pNVar7;
        iVar2 = pmVar5->cost;
        local_48->gx = pQVar6->gx + (long)iVar2;
        local_48->fx = (long)iVar2 + pNVar7->cost + pQVar6->gx;
        local_48->next = pQVar6;
        std::
        priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
        ::push(&this->agenda_,&local_48);
        ppmVar8 = &pmVar5->lnext;
      }
    }
  } while (uVar1 != '\x02');
  return ppQVar3 != local_40;
}

Assistant:

bool NBestGenerator::next() {
  while (!agenda_.empty()) {
    QueueElement *top = agenda_.top();
    agenda_.pop();
    Node *rnode = top->node;

    if (rnode->stat == MECAB_BOS_NODE) {  // BOS
      for (QueueElement *n = top; n->next; n = n->next) {
        n->node->next = n->next->node;   // change next & prev
        n->next->node->prev = n->node;
        // TODO: rewrite costs;
      }
      return true;
    }

    for (Path *path = rnode->lpath; path; path = path->lnext) {
      QueueElement *n = freelist_.alloc();
      n->node = path->lnode;
      n->gx = path->cost + top->gx;
      n->fx = path->lnode->cost + path->cost + top->gx;
      n->next = top;
      agenda_.push(n);
    }
  }

  return false;
}